

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O0

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,ProgramNode *node)

{
  bool bVar1;
  __optional_ne_t<TypeName,_TypeName> _Var2;
  pointer pVVar3;
  pointer pFVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  _Storage<std::reference_wrapper<Symbol>,_true> __s;
  reference_wrapper<Symbol> *this_01;
  Symbol *pSVar5;
  undefined1 uVar6;
  ProgramNode *in_RSI;
  long in_RDI;
  optional<std::reference_wrapper<Symbol>_> oVar7;
  Node *in_stack_00000058;
  string *in_stack_00000060;
  FunctionAnalyser analyser;
  optional<std::reference_wrapper<Symbol>_> symbol;
  unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_> *func;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  list<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
  *__range1_1;
  unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_> *var;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
  *__range1;
  list<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
  *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  char *in_stack_fffffffffffffe98;
  int maxDepth;
  string *in_stack_fffffffffffffeb8;
  SymbolTable *in_stack_fffffffffffffec0;
  FunctionAnalyser local_f0 [2];
  allocator<char> local_81;
  string local_80 [32];
  _Storage<std::reference_wrapper<Symbol>,_true> local_60;
  undefined1 local_58;
  reference local_50;
  _Self local_48;
  _Self local_40;
  list<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
  *local_38;
  reference local_30;
  _Self local_28;
  _Self local_20;
  list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
  *local_18;
  ProgramNode *local_10;
  
  local_10 = in_RSI;
  local_18 = ProgramNode::getVariables_abi_cxx11_(in_RSI);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
       ::begin((list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
                *)in_stack_fffffffffffffe58);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
       ::end((list<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>,_std::allocator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>_>
              *)in_stack_fffffffffffffe58);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30 = std::
               _List_const_iterator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>
               ::operator*((_List_const_iterator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>
                            *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    pVVar3 = std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>
             ::operator->((unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>
                           *)0x14c890);
    (*(pVVar3->super_StatementNode).super_Node._vptr_Node[2])(pVVar3,in_RDI);
    std::
    _List_const_iterator<std::unique_ptr<VariableDeclarationNode,_std::default_delete<VariableDeclarationNode>_>_>
    ::operator++(&local_20);
  }
  local_38 = ProgramNode::getFunctions_abi_cxx11_(local_10);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
       ::begin(in_stack_fffffffffffffe58);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>,_std::allocator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>_>
       ::end(in_stack_fffffffffffffe58);
  while( true ) {
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    local_50 = std::
               _List_const_iterator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>
               ::operator*((_List_const_iterator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>
                            *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    pFVar4 = std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>
             ::operator->((unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>
                           *)0x14c929);
    (*(pFVar4->super_StatementNode).super_Node._vptr_Node[2])(pFVar4,in_RDI);
    std::
    _List_const_iterator<std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_>
    ::operator++(&local_40);
  }
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
  std::allocator<char>::allocator();
  maxDepth = (int)((ulong)in_RDI >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffe98,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  oVar7 = SymbolTable::lookup(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,maxDepth);
  __s = oVar7.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
        super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload;
  uVar6 = oVar7.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
          super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_engaged;
  local_60 = __s;
  local_58 = uVar6;
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::reference_wrapper<Symbol>_> *)0x14c9df);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)__s,(allocator<char> *)CONCAT17(uVar6,in_stack_fffffffffffffe90));
    reportError(in_stack_00000060,in_stack_00000058);
  }
  FunctionAnalyser::FunctionAnalyser
            ((FunctionAnalyser *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  this_01 = std::optional<std::reference_wrapper<Symbol>_>::value
                      ((optional<std::reference_wrapper<Symbol>_> *)
                       CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  pSVar5 = std::reference_wrapper<Symbol>::get(this_01);
  (*pSVar5->_vptr_Symbol[2])(pSVar5,local_f0);
  bVar1 = FunctionAnalyser::isSymbolValid(local_f0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)__s,(allocator<char> *)CONCAT17(uVar6,in_stack_fffffffffffffe90));
    reportError(in_stack_00000060,in_stack_00000058);
  }
  FunctionAnalyser::getReturnType(local_f0);
  _Var2 = std::operator!=((optional<TypeName> *)
                          CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                          (TypeName *)in_stack_fffffffffffffe58);
  if (!_Var2) {
    FunctionAnalyser::~FunctionAnalyser
              ((FunctionAnalyser *)CONCAT17(_Var2,in_stack_fffffffffffffe60));
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)__s,(allocator<char> *)CONCAT17(uVar6,in_stack_fffffffffffffe90));
  reportError(in_stack_00000060,in_stack_00000058);
}

Assistant:

void SemanticAnalyser::visit(const ProgramNode& node) 
{
  for(const auto& var : node.getVariables())
    var->accept(*this);
  
  for(const auto& func : node.getFunctions())
    func->accept(*this);

  const auto symbol = symbols_.lookup("main");
  if(!symbol)
    reportError("Main function was not found!", node);
  
  FunctionAnalyser analyser{};
  symbol.value().get().accept(analyser);
  if(!analyser.isSymbolValid())
    reportError("Symbol main does not name a function!", node);
  else if(analyser.getReturnType() != TypeName::F32)
    reportError("Main should return F32!", node);
}